

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianOptimizationWrapC.cpp
# Opt level: O1

ObjectiveFunctionSingle *
TasOptimization::convert_C_obj_fn_single
          (ObjectiveFunctionSingle *__return_storage_ptr__,tsg_optim_obj_fn_single func_ptr,
          string *err_msg)

{
  pointer pcVar1;
  undefined8 *puVar2;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  pcVar1 = (err_msg->_M_dataplus)._M_p;
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + err_msg->_M_string_length);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = func_ptr;
  puVar2[1] = puVar2 + 3;
  if (local_30 == &local_20) {
    puVar2[3] = CONCAT71(uStack_1f,local_20);
    puVar2[4] = uStack_18;
  }
  else {
    puVar2[1] = local_30;
    puVar2[3] = CONCAT71(uStack_1f,local_20);
  }
  puVar2[2] = local_28;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/TasmanianOptimizationWrapC.cpp:54:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/TasmanianOptimizationWrapC.cpp:54:12)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

ObjectiveFunctionSingle convert_C_obj_fn_single(tsg_optim_obj_fn_single func_ptr, std::string err_msg) {
    return [=](const std::vector<double> &x_single)->double {
        int err_code = 0;
        int num_dims = x_single.size();
        double result = (*func_ptr)(num_dims, x_single.data(), &err_code);
        if (err_code != 0) throw std::runtime_error(err_msg);
        return result;
    };
}